

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

void FTransformWHT_SSE2(int16_t *in,int16_t *out)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined1 auVar7 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar6 [12];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  
  uVar1 = *(ulong *)in;
  uVar2 = *(undefined8 *)(in + 0x10);
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10._12_2_ = (short)(uVar1 >> 0x30);
  auVar10._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar9._12_4_ = auVar10._12_4_;
  auVar9._8_2_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar8._10_6_ = auVar9._10_6_;
  auVar8._8_2_ = (short)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar7._8_8_ = auVar8._8_8_;
  auVar7._6_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar7._4_2_ = (short)(uVar1 >> 0x10);
  auVar7._0_2_ = (undefined2)uVar1;
  auVar7._2_2_ = (short)uVar2;
  uVar1 = *(ulong *)(in + 0x20);
  uVar2 = *(undefined8 *)(in + 0x30);
  auVar15._8_4_ = 0;
  auVar15._0_8_ = uVar1;
  auVar15._12_2_ = (short)(uVar1 >> 0x30);
  auVar15._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar41._12_4_ = auVar15._12_4_;
  auVar41._8_2_ = 0;
  auVar41._0_8_ = uVar1;
  auVar41._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar31._10_6_ = auVar41._10_6_;
  auVar31._8_2_ = (short)(uVar1 >> 0x20);
  auVar31._0_8_ = uVar1;
  auVar11._8_8_ = auVar31._8_8_;
  auVar11._6_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar11._4_2_ = (short)(uVar1 >> 0x10);
  auVar11._0_2_ = (undefined2)uVar1;
  auVar11._2_2_ = (short)uVar2;
  auVar15 = paddsw(auVar7,auVar11);
  auVar11 = psubsw(auVar7,auVar11);
  auVar47._0_4_ = auVar15._0_4_;
  auVar47._4_4_ = auVar11._0_4_;
  auVar47._12_4_ = auVar47._0_4_;
  auVar47._8_4_ = auVar11._0_4_;
  auVar11 = pmaddwd(auVar47,_DAT_001b5810);
  uVar1 = *(ulong *)(in + 0x40);
  uVar2 = *(undefined8 *)(in + 0x50);
  auVar25._8_4_ = 0;
  auVar25._0_8_ = uVar1;
  auVar25._12_2_ = (short)(uVar1 >> 0x30);
  auVar25._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._8_2_ = 0;
  auVar24._0_8_ = uVar1;
  auVar24._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._8_2_ = (short)(uVar1 >> 0x20);
  auVar23._0_8_ = uVar1;
  auVar22._8_8_ = auVar23._8_8_;
  auVar22._6_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar22._4_2_ = (short)(uVar1 >> 0x10);
  auVar22._0_2_ = (undefined2)uVar1;
  auVar22._2_2_ = (short)uVar2;
  uVar1 = *(ulong *)(in + 0x60);
  uVar2 = *(undefined8 *)(in + 0x70);
  auVar19._8_4_ = 0;
  auVar19._0_8_ = uVar1;
  auVar19._12_2_ = (short)(uVar1 >> 0x30);
  auVar19._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._8_2_ = 0;
  auVar18._0_8_ = uVar1;
  auVar18._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar17._10_6_ = auVar18._10_6_;
  auVar17._8_2_ = (short)(uVar1 >> 0x20);
  auVar17._0_8_ = uVar1;
  auVar16._8_8_ = auVar17._8_8_;
  auVar16._6_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar16._4_2_ = (short)(uVar1 >> 0x10);
  auVar16._0_2_ = (undefined2)uVar1;
  auVar16._2_2_ = (short)uVar2;
  auVar31 = paddsw(auVar22,auVar16);
  auVar15 = psubsw(auVar22,auVar16);
  auVar20._0_4_ = auVar31._0_4_;
  auVar20._4_4_ = auVar15._0_4_;
  auVar20._12_4_ = auVar20._0_4_;
  auVar20._8_4_ = auVar15._0_4_;
  auVar15 = pmaddwd(auVar20,_DAT_001b5810);
  uVar1 = *(ulong *)(in + 0x80);
  uVar2 = *(undefined8 *)(in + 0x90);
  auVar35._8_4_ = 0;
  auVar35._0_8_ = uVar1;
  auVar35._12_2_ = (short)(uVar1 >> 0x30);
  auVar35._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar34._12_4_ = auVar35._12_4_;
  auVar34._8_2_ = 0;
  auVar34._0_8_ = uVar1;
  auVar34._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar33._10_6_ = auVar34._10_6_;
  auVar33._8_2_ = (short)(uVar1 >> 0x20);
  auVar33._0_8_ = uVar1;
  auVar32._8_8_ = auVar33._8_8_;
  auVar32._6_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar32._4_2_ = (short)(uVar1 >> 0x10);
  auVar32._0_2_ = (undefined2)uVar1;
  auVar32._2_2_ = (short)uVar2;
  uVar1 = *(ulong *)(in + 0xa0);
  uVar2 = *(undefined8 *)(in + 0xb0);
  auVar29._8_4_ = 0;
  auVar29._0_8_ = uVar1;
  auVar29._12_2_ = (short)(uVar1 >> 0x30);
  auVar29._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar28._12_4_ = auVar29._12_4_;
  auVar28._8_2_ = 0;
  auVar28._0_8_ = uVar1;
  auVar28._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar27._10_6_ = auVar28._10_6_;
  auVar27._8_2_ = (short)(uVar1 >> 0x20);
  auVar27._0_8_ = uVar1;
  auVar26._8_8_ = auVar27._8_8_;
  auVar26._6_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar26._4_2_ = (short)(uVar1 >> 0x10);
  auVar26._0_2_ = (undefined2)uVar1;
  auVar26._2_2_ = (short)uVar2;
  auVar41 = paddsw(auVar32,auVar26);
  auVar31 = psubsw(auVar32,auVar26);
  auVar30._0_4_ = auVar41._0_4_;
  auVar30._4_4_ = auVar31._0_4_;
  auVar30._12_4_ = auVar30._0_4_;
  auVar30._8_4_ = auVar31._0_4_;
  auVar31 = pmaddwd(auVar30,_DAT_001b5810);
  uVar1 = *(ulong *)(in + 0xc0);
  uVar2 = *(undefined8 *)(in + 0xd0);
  auVar39._8_4_ = 0;
  auVar39._0_8_ = uVar1;
  auVar39._12_2_ = (short)(uVar1 >> 0x30);
  auVar39._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar38._12_4_ = auVar39._12_4_;
  auVar38._8_2_ = 0;
  auVar38._0_8_ = uVar1;
  auVar38._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar37._10_6_ = auVar38._10_6_;
  auVar37._8_2_ = (short)(uVar1 >> 0x20);
  auVar37._0_8_ = uVar1;
  auVar36._8_8_ = auVar37._8_8_;
  auVar36._6_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar36._4_2_ = (short)(uVar1 >> 0x10);
  auVar36._0_2_ = (undefined2)uVar1;
  auVar36._2_2_ = (short)uVar2;
  uVar1 = *(ulong *)(in + 0xe0);
  uVar2 = *(undefined8 *)(in + 0xf0);
  auVar45._8_4_ = 0;
  auVar45._0_8_ = uVar1;
  auVar45._12_2_ = (short)(uVar1 >> 0x30);
  auVar45._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar44._12_4_ = auVar45._12_4_;
  auVar44._8_2_ = 0;
  auVar44._0_8_ = uVar1;
  auVar44._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar43._10_6_ = auVar44._10_6_;
  auVar43._8_2_ = (short)(uVar1 >> 0x20);
  auVar43._0_8_ = uVar1;
  auVar42._8_8_ = auVar43._8_8_;
  auVar42._6_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar42._4_2_ = (short)(uVar1 >> 0x10);
  auVar42._0_2_ = (undefined2)uVar1;
  auVar42._2_2_ = (short)uVar2;
  auVar47 = paddsw(auVar36,auVar42);
  auVar41 = psubsw(auVar36,auVar42);
  auVar46._0_4_ = auVar47._0_4_;
  auVar46._4_4_ = auVar41._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar41._0_4_;
  auVar41 = pmaddwd(auVar46,_DAT_001b5810);
  auVar12._0_4_ = auVar31._0_4_ + auVar11._0_4_;
  auVar12._4_4_ = auVar31._4_4_ + auVar11._4_4_;
  auVar12._8_4_ = auVar31._8_4_ + auVar11._8_4_;
  auVar12._12_4_ = auVar31._12_4_ + auVar11._12_4_;
  auVar40._0_4_ = auVar41._0_4_ + auVar15._0_4_;
  auVar40._4_4_ = auVar41._4_4_ + auVar15._4_4_;
  auVar40._8_4_ = auVar41._8_4_ + auVar15._8_4_;
  auVar40._12_4_ = auVar41._12_4_ + auVar15._12_4_;
  auVar21._0_4_ = auVar15._0_4_ - auVar41._0_4_;
  auVar21._4_4_ = auVar15._4_4_ - auVar41._4_4_;
  auVar21._8_4_ = auVar15._8_4_ - auVar41._8_4_;
  auVar21._12_4_ = auVar15._12_4_ - auVar41._12_4_;
  auVar15 = packssdw(auVar40,auVar21);
  auVar3._0_4_ = auVar11._0_4_ - auVar31._0_4_;
  auVar3._4_4_ = auVar11._4_4_ - auVar31._4_4_;
  auVar3._8_4_ = auVar11._8_4_ - auVar31._8_4_;
  auVar3._12_4_ = auVar11._12_4_ - auVar31._12_4_;
  auVar11 = packssdw(auVar12,auVar3);
  auVar4._0_2_ = auVar15._0_2_ + auVar11._0_2_;
  auVar4._2_2_ = auVar15._2_2_ + auVar11._2_2_;
  auVar4._4_2_ = auVar15._4_2_ + auVar11._4_2_;
  auVar4._6_2_ = auVar15._6_2_ + auVar11._6_2_;
  auVar4._8_2_ = auVar15._8_2_ + auVar11._8_2_;
  auVar4._10_2_ = auVar15._10_2_ + auVar11._10_2_;
  auVar4._12_2_ = auVar15._12_2_ + auVar11._12_2_;
  auVar4._14_2_ = auVar15._14_2_ + auVar11._14_2_;
  uVar5 = CONCAT22(auVar11._2_2_ - auVar15._2_2_,auVar11._0_2_ - auVar15._0_2_);
  auVar6._0_8_ = CONCAT26(auVar11._6_2_ - auVar15._6_2_,
                          CONCAT24(auVar11._4_2_ - auVar15._4_2_,uVar5));
  auVar6._8_2_ = auVar11._8_2_ - auVar15._8_2_;
  auVar6._10_2_ = auVar11._10_2_ - auVar15._10_2_;
  auVar13._12_2_ = auVar11._12_2_ - auVar15._12_2_;
  auVar13._0_12_ = auVar6;
  auVar13._14_2_ = auVar11._14_2_ - auVar15._14_2_;
  auVar14._4_4_ = auVar13._12_4_;
  auVar14._0_4_ = auVar6._8_4_;
  auVar14._8_4_ = uVar5;
  auVar14._12_4_ = (int)((ulong)auVar6._0_8_ >> 0x20);
  auVar11 = psraw(auVar4,1);
  *(undefined1 (*) [16])out = auVar11;
  auVar11 = psraw(auVar14,1);
  *(undefined1 (*) [16])(out + 8) = auVar11;
  return;
}

Assistant:

static void FTransformWHTRow_SSE2(const int16_t* WEBP_RESTRICT const in,
                                  __m128i* const out) {
  const __m128i kMult = _mm_set_epi16(-1, 1, -1, 1, 1, 1, 1, 1);
  const __m128i src0 = _mm_loadl_epi64((__m128i*)&in[0 * 16]);
  const __m128i src1 = _mm_loadl_epi64((__m128i*)&in[1 * 16]);
  const __m128i src2 = _mm_loadl_epi64((__m128i*)&in[2 * 16]);
  const __m128i src3 = _mm_loadl_epi64((__m128i*)&in[3 * 16]);
  const __m128i A01 = _mm_unpacklo_epi16(src0, src1);  // A0 A1 | ...
  const __m128i A23 = _mm_unpacklo_epi16(src2, src3);  // A2 A3 | ...
  const __m128i B0 = _mm_adds_epi16(A01, A23);    // a0 | a1 | ...
  const __m128i B1 = _mm_subs_epi16(A01, A23);    // a3 | a2 | ...
  const __m128i C0 = _mm_unpacklo_epi32(B0, B1);  // a0 | a1 | a3 | a2 | ...
  const __m128i C1 = _mm_unpacklo_epi32(B1, B0);  // a3 | a2 | a0 | a1 | ...
  const __m128i D = _mm_unpacklo_epi64(C0, C1);   // a0 a1 a3 a2 a3 a2 a0 a1
  *out = _mm_madd_epi16(D, kMult);
}